

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s_net.c
# Opt level: O0

int socket_set_nonblocking(int socket,int nonblocking)

{
  int iVar1;
  undefined4 local_18;
  int sockflags;
  int nonblocking_local;
  int socket_local;
  
  local_18 = fcntl(socket,3,0);
  if (nonblocking == 0) {
    local_18 = local_18 & 0xfffff7ff;
  }
  else {
    local_18 = local_18 | 0x800;
  }
  iVar1 = fcntl(socket,4,(ulong)local_18);
  if (iVar1 < 0) {
    nonblocking_local = -1;
  }
  else {
    nonblocking_local = 0;
  }
  return nonblocking_local;
}

Assistant:

int socket_set_nonblocking(int socket, int nonblocking)
{
#ifdef _WIN32
    u_long modearg = nonblocking;
    if (ioctlsocket(socket, FIONBIO, &modearg) != NO_ERROR)
        return -1;
#else
    int sockflags = fcntl(socket, F_GETFL, 0);
    if (nonblocking)
        sockflags |= O_NONBLOCK;
    else
        sockflags &= ~O_NONBLOCK;
    if (fcntl(socket, F_SETFL, sockflags) < 0)
        return -1;
#endif
    return 0;
}